

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

void __thiscall
mkvparser::Track::Track(Track *this,Segment *pSegment,longlong element_start,longlong element_size)

{
  this->_vptr_Track = (_func_int **)&PTR__Track_0013fb78;
  this->m_pSegment = pSegment;
  this->m_element_start = element_start;
  this->m_element_size = element_size;
  (this->m_info).uid = 0;
  (this->m_info).defaultDuration = 0;
  (this->m_info).codecDelay = 0;
  (this->m_info).seekPreRoll = 0;
  (this->m_info).nameAsUTF8 = (char *)0x0;
  (this->m_info).language = (char *)0x0;
  (this->m_info).codecId = (char *)0x0;
  (this->m_info).codecNameAsUTF8 = (char *)0x0;
  (this->m_info).codecPrivate = (uchar *)0x0;
  (this->m_info).codecPrivateSize = 0;
  (this->m_info).lacing = false;
  (this->m_eos).super_BlockEntry.m_pCluster = (Cluster *)0x0;
  (this->m_eos).super_BlockEntry.m_index = -0x8000000000000000;
  (this->m_eos).super_BlockEntry._vptr_BlockEntry = (_func_int **)&PTR__BlockEntry_0013fba8;
  this->content_encoding_entries_ = (ContentEncoding **)0x0;
  this->content_encoding_entries_end_ = (ContentEncoding **)0x0;
  return;
}

Assistant:

Track::Track(Segment* pSegment, long long element_start, long long element_size)
    : m_pSegment(pSegment),
      m_element_start(element_start),
      m_element_size(element_size),
      content_encoding_entries_(NULL),
      content_encoding_entries_end_(NULL) {}